

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O0

CURLcode Curl_dynhds_add(dynhds *dynhds,char *name,size_t namelen,char *value,size_t valuelen)

{
  size_t sVar1;
  dynhds_entry **__dest;
  dynhds_entry **nhds;
  size_t nallc;
  dynhds_entry *pdStack_40;
  CURLcode result;
  dynhds_entry *entry;
  size_t valuelen_local;
  char *value_local;
  size_t namelen_local;
  char *name_local;
  dynhds *dynhds_local;
  
  nallc._4_4_ = CURLE_OUT_OF_MEMORY;
  if ((dynhds->max_entries != 0) && (dynhds->max_entries <= dynhds->hds_len)) {
    return CURLE_OUT_OF_MEMORY;
  }
  if (dynhds->max_strs_size < dynhds->strs_len + namelen + valuelen) {
    return CURLE_OUT_OF_MEMORY;
  }
  pdStack_40 = entry_new(name,namelen,value,valuelen,dynhds->opts);
  if (pdStack_40 != (dynhds_entry *)0x0) {
    if (dynhds->hds_allc <= dynhds->hds_len + 1) {
      nhds = (dynhds_entry **)(dynhds->hds_len + 0x10);
      if ((dynhds->max_entries != 0) && ((dynhds_entry **)dynhds->max_entries < nhds)) {
        nhds = (dynhds_entry **)dynhds->max_entries;
      }
      __dest = (dynhds_entry **)(*Curl_ccalloc)((size_t)nhds,8);
      if (__dest == (dynhds_entry **)0x0) goto LAB_0013285f;
      if (dynhds->hds != (dynhds_entry **)0x0) {
        memcpy(__dest,dynhds->hds,dynhds->hds_len << 3);
        (*Curl_cfree)(dynhds->hds);
        dynhds->hds = (dynhds_entry **)0x0;
      }
      dynhds->hds = __dest;
      dynhds->hds_allc = (size_t)nhds;
    }
    sVar1 = dynhds->hds_len;
    dynhds->hds_len = sVar1 + 1;
    dynhds->hds[sVar1] = pdStack_40;
    pdStack_40 = (dynhds_entry *)0x0;
    dynhds->strs_len = namelen + valuelen + dynhds->strs_len;
    nallc._4_4_ = CURLE_OK;
  }
LAB_0013285f:
  if (pdStack_40 != (dynhds_entry *)0x0) {
    entry_free(pdStack_40);
  }
  return nallc._4_4_;
}

Assistant:

CURLcode Curl_dynhds_add(struct dynhds *dynhds,
                         const char *name, size_t namelen,
                         const char *value, size_t valuelen)
{
  struct dynhds_entry *entry = NULL;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  DEBUGASSERT(dynhds);
  if(dynhds->max_entries && dynhds->hds_len >= dynhds->max_entries)
    return CURLE_OUT_OF_MEMORY;
  if(dynhds->strs_len + namelen + valuelen > dynhds->max_strs_size)
    return CURLE_OUT_OF_MEMORY;

entry = entry_new(name, namelen, value, valuelen, dynhds->opts);
  if(!entry)
    goto out;

  if(dynhds->hds_len + 1 >= dynhds->hds_allc) {
    size_t nallc = dynhds->hds_len + 16;
    struct dynhds_entry **nhds;

    if(dynhds->max_entries && nallc > dynhds->max_entries)
      nallc = dynhds->max_entries;

    nhds = calloc(nallc, sizeof(struct dynhds_entry *));
    if(!nhds)
      goto out;
    if(dynhds->hds) {
      memcpy(nhds, dynhds->hds,
             dynhds->hds_len * sizeof(struct dynhds_entry *));
      Curl_safefree(dynhds->hds);
    }
    dynhds->hds = nhds;
    dynhds->hds_allc = nallc;
  }
  dynhds->hds[dynhds->hds_len++] = entry;
  entry = NULL;
  dynhds->strs_len += namelen + valuelen;
  result = CURLE_OK;

out:
  if(entry)
    entry_free(entry);
  return result;
}